

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_to_bytes(uchar *buf,secp256k1_ge *a)

{
  ulong uVar1;
  ulong uVar2;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar3;
  secp256k1_ge *psVar4;
  secp256k1_ge *r;
  secp256k1_ge *a_01;
  secp256k1_ge_storage s;
  undefined1 auStack_d0 [104];
  secp256k1_ge *psStack_68;
  secp256k1_ge_storage local_58;
  
  a_00 = a;
  psVar4 = a;
  secp256k1_ge_verify(a);
  if (a->infinity == 0) {
    secp256k1_ge_to_storage(&local_58,a);
    *(uint64_t *)(buf + 0x30) = local_58.y.n[2];
    *(uint64_t *)(buf + 0x38) = local_58.y.n[3];
    *(uint64_t *)(buf + 0x20) = local_58.y.n[0];
    *(uint64_t *)(buf + 0x28) = local_58.y.n[1];
    *(uint64_t *)(buf + 0x10) = local_58.x.n[2];
    *(uint64_t *)(buf + 0x18) = local_58.x.n[3];
    *(uint64_t *)buf = local_58.x.n[0];
    *(uint64_t *)(buf + 8) = local_58.x.n[1];
    return;
  }
  secp256k1_ge_to_bytes_cold_1();
  a_01 = (secp256k1_ge *)auStack_d0;
  psVar3 = a_00;
  r = a_00;
  auStack_d0._96_8_ = buf;
  psStack_68 = a;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    auStack_d0._48_8_ = (a_00->x).n[0];
    auStack_d0._56_8_ = (a_00->x).n[1];
    auStack_d0._64_8_ = (a_00->x).n[2];
    auStack_d0._72_8_ = (a_00->x).n[3];
    auStack_d0._80_8_ = (a_00->x).n[4];
    auStack_d0._88_4_ = (a_00->x).magnitude;
    auStack_d0._92_4_ = (a_00->x).normalized;
    r = (secp256k1_ge *)(auStack_d0 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r);
    auStack_d0._0_8_ = (a_00->y).n[0];
    auStack_d0._8_8_ = (a_00->y).n[1];
    auStack_d0._16_8_ = (a_00->y).n[2];
    auStack_d0._24_8_ = (a_00->y).n[3];
    auStack_d0._32_8_ = (a_00->y).n[4];
    auStack_d0._40_4_ = (a_00->y).magnitude;
    auStack_d0._44_4_ = (a_00->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_d0);
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (auStack_d0._92_4_ != 0) {
      (psVar4->x).n[0] = auStack_d0._56_8_ << 0x34 | auStack_d0._48_8_;
      (psVar4->x).n[1] = auStack_d0._64_8_ << 0x28 | (ulong)auStack_d0._56_8_ >> 0xc;
      (psVar4->x).n[2] = auStack_d0._72_8_ << 0x1c | (ulong)auStack_d0._64_8_ >> 0x18;
      (psVar4->x).n[3] = auStack_d0._80_8_ << 0x10 | (ulong)auStack_d0._72_8_ >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_d0);
      if (auStack_d0._44_4_ != 0) {
        (psVar4->x).n[4] = auStack_d0._8_8_ << 0x34 | auStack_d0._0_8_;
        uVar2 = auStack_d0._16_8_ << 0x28 | (ulong)auStack_d0._8_8_ >> 0xc;
        (psVar4->x).magnitude = (int)uVar2;
        (psVar4->x).normalized = (int)(uVar2 >> 0x20);
        (psVar4->y).n[0] = auStack_d0._24_8_ << 0x1c | (ulong)auStack_d0._16_8_ >> 0x18;
        (psVar4->y).n[1] = auStack_d0._32_8_ << 0x10 | (ulong)auStack_d0._24_8_ >> 0x24;
        return;
      }
      goto LAB_001487bf;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_01 = r;
  secp256k1_ge_to_storage_cold_3();
LAB_001487bf:
  secp256k1_ge_to_storage_cold_2();
  (a_01->x).n[0] = (psVar3->x).n[0] & 0xfffffffffffff;
  (a_01->x).n[1] = ((psVar3->x).n[1] & 0xffffffffff) << 0xc | (psVar3->x).n[0] >> 0x34;
  (a_01->x).n[2] = ((psVar3->x).n[2] & 0xfffffff) << 0x18 | (psVar3->x).n[1] >> 0x28;
  (a_01->x).n[3] = ((psVar3->x).n[3] & 0xffff) << 0x24 | (psVar3->x).n[2] >> 0x1c;
  (a_01->x).n[4] = (psVar3->x).n[3] >> 0x10;
  (a_01->x).magnitude = 1;
  (a_01->x).normalized = 1;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).n[0] = (psVar3->x).n[4] & 0xfffffffffffff;
  uVar2._0_4_ = (psVar3->x).magnitude;
  uVar2._4_4_ = (psVar3->x).normalized;
  (a_01->y).n[1] = (uVar2 & 0xffffffffff) << 0xc | (psVar3->x).n[4] >> 0x34;
  uVar1._0_4_ = (psVar3->x).magnitude;
  uVar1._4_4_ = (psVar3->x).normalized;
  (a_01->y).n[2] = ((psVar3->y).n[0] & 0xfffffff) << 0x18 | uVar1 >> 0x28;
  (a_01->y).n[3] = ((psVar3->y).n[1] & 0xffff) << 0x24 | (psVar3->y).n[0] >> 0x1c;
  (a_01->y).n[4] = (psVar3->y).n[1] >> 0x10;
  (a_01->y).magnitude = 1;
  (a_01->y).normalized = 1;
  secp256k1_fe_verify(&a_01->y);
  a_01->infinity = 0;
  secp256k1_ge_verify(a_01);
  return;
}

Assistant:

static void secp256k1_ge_to_bytes(unsigned char *buf, const secp256k1_ge *a) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(a));
    secp256k1_ge_to_storage(&s, a);
    memcpy(buf, &s, 64);
}